

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Call::~Call(Call *this)

{
  Call *this_local;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_00187ef0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_00187f10;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&this->args);
  std::__cxx11::string::~string((string *)&this->funcName);
  Definition::~Definition(&this->super_Definition);
  IRInst::~IRInst(&this->super_IRInst);
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}